

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jinx.hpp
# Opt level: O0

String * Jinx::Impl::ConvertWStringToUtf8(String *__return_storage_ptr__,WString *wStr)

{
  char32_t utf32CodePoint;
  size_type __res;
  size_t outBufferCount;
  size_t local_48;
  size_t numOut;
  char outBuffer [5];
  char32_t *local_20;
  char32_t *cInStr;
  WString *wStr_local;
  String *outString;
  
  local_20 = std::__cxx11::
             basic_string<wchar_t,_std::char_traits<wchar_t>,_Jinx::Allocator<wchar_t>_>::c_str
                       (wStr);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::basic_string
            (__return_storage_ptr__);
  __res = std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_Jinx::Allocator<wchar_t>_>
          ::size(wStr);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::reserve
            (__return_storage_ptr__,__res);
  memset((void *)((long)&numOut + 7),0,5);
  local_48 = 0;
  while (*local_20 != L'\0') {
    utf32CodePoint = *local_20;
    outBufferCount = std::size<char,5ul>((char (*) [5])((long)&numOut + 7));
    ConvertUtf32ToUtf8(utf32CodePoint,(char *)((long)&numOut + 7),outBufferCount,&local_48);
    *(undefined1 *)((long)&numOut + local_48 + 7) = 0;
    local_20 = local_20 + 1;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::operator+=
              (__return_storage_ptr__,(char *)((long)&numOut + 7));
  }
  return __return_storage_ptr__;
}

Assistant:

inline String ConvertWStringToUtf8(const WString & wStr)
	{
		// Compile-time check to determine size of wchar_t, and perform appropriate UTF-16 or UTF-32 conversion
		if constexpr (sizeof(wchar_t) == 4)
		{
			auto cInStr = reinterpret_cast<const char32_t *>(wStr.c_str());
			String outString;
			outString.reserve(wStr.size());
			char outBuffer[5] = { 0, 0, 0, 0, 0 };
			size_t numOut = 0;
			while (*cInStr != 0)
			{
				Impl::ConvertUtf32ToUtf8(*cInStr, outBuffer, std::size(outBuffer), &numOut);
				outBuffer[numOut] = 0;
				++cInStr;
				outString += outBuffer;
			}
			return outString;
		}
		else
		{
			return ConvertUtf16ToUtf8(reinterpret_cast<const char16_t *>(wStr.c_str()));
		}
	}